

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fits_copy_image_section(fitsfile *fptr,fitsfile *newptr,char *expr,int *status)

{
  long lVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  double dVar11;
  double local_350;
  double cdelt;
  double crpix;
  double *buffer;
  long buffsize;
  long outsize;
  long outnaxes [9];
  int local_2d8;
  int jj;
  int kk;
  int klen;
  long iiter;
  long jiter;
  long kiter;
  long nrowiter;
  long nsliceiter;
  long ncubeiter;
  long firstpix;
  long maxcube;
  long mincube;
  long maxslice;
  long minslice;
  long maxrow;
  long minrow;
  int local_260;
  int anynull;
  int tstatus;
  int ii;
  char card [81];
  char local_1f8 [8];
  char keyname [75];
  int *local_1a0;
  char *cptr;
  long incs [9];
  long local_148;
  long lpixels [9];
  long local_f8;
  long fpixels [9];
  long sinc;
  long smax;
  long smin;
  long naxes [9];
  int local_48;
  int local_44;
  int nkey;
  int numkeys;
  int naxis;
  int bitpix;
  int *status_local;
  char *expr_local;
  fitsfile *newptr_local;
  fitsfile *fptr_local;
  
  _naxis = status;
  status_local = (int *)expr;
  expr_local = (char *)newptr;
  newptr_local = fptr;
  memcpy(&smin,&DAT_00288220,0x48);
  memcpy(&local_f8,&DAT_00288270,0x48);
  memcpy(&local_148,&DAT_002882c0,0x48);
  memcpy(&cptr,&DAT_00288310,0x48);
  if (*_naxis < 1) {
    ffgidt(newptr_local,&numkeys,_naxis);
    ffgidm(newptr_local,&nkey,_naxis);
    iVar8 = ffgisz(newptr_local,nkey,&smin,_naxis);
    if (iVar8 < 1) {
      if ((nkey < 1) || (4 < nkey)) {
        ffpmsg("Input image either had NAXIS = 0 (NULL image) or has > 4 dimensions");
        *_naxis = 0xd4;
        fptr_local._4_4_ = 0xd4;
      }
      else {
        ffcrim((fitsfile *)expr_local,numkeys,nkey,&smin,_naxis);
        ffghsp(newptr_local,&local_44,(int *)0x0,_naxis);
        for (local_48 = 4; local_48 <= local_44; local_48 = local_48 + 1) {
          ffgrec(newptr_local,local_48,(char *)&tstatus,_naxis);
          iVar8 = ffgkcl((char *)&tstatus);
          if (0x14 < iVar8) {
            ffprec((fitsfile *)expr_local,(char *)&tstatus,_naxis);
          }
        }
        if (*_naxis < 1) {
          local_1a0 = status_local;
          for (anynull = 0; anynull < nkey; anynull = anynull + 1) {
            iVar8 = fits_get_section_range((char **)&local_1a0,&smax,&sinc,fpixels + 8,_naxis);
            if (0 < iVar8) {
              ffpmsg("error parsing the following image section specifier:");
              ffpmsg((char *)status_local);
              return *_naxis;
            }
            if (sinc == 0) {
              sinc = naxes[(long)anynull + -1];
            }
            else if (smax == 0) {
              smax = naxes[(long)anynull + -1];
            }
            if ((naxes[(long)anynull + -1] < smax) || (naxes[(long)anynull + -1] < sinc)) {
              ffpmsg("image section exceeds dimensions of input image:");
              ffpmsg((char *)status_local);
              *_naxis = 0xd4;
              return 0xd4;
            }
            fpixels[(long)anynull + -1] = smax;
            lpixels[(long)anynull + -1] = sinc;
            incs[(long)anynull + -1] = fpixels[8];
            if (sinc < smax) {
              outnaxes[(long)anynull + -1] = ((smax - sinc) + fpixels[8]) / fpixels[8];
            }
            else {
              outnaxes[(long)anynull + -1] = ((sinc - smax) + fpixels[8]) / fpixels[8];
            }
            ffkeyn("NAXIS",anynull + 1,local_1f8,_naxis);
            ffmkyj((fitsfile *)expr_local,local_1f8,outnaxes[(long)anynull + -1],(char *)0x0,_naxis)
            ;
            if ((fpixels[(long)anynull + -1] != 1) || (incs[(long)anynull + -1] != 1)) {
              for (local_2d8 = -1; local_2d8 < 0x1a; local_2d8 = local_2d8 + 1) {
                ffkeyn("CRPIX",anynull + 1,local_1f8,_naxis);
                cVar2 = (char)local_2d8;
                if (local_2d8 != -1) {
                  sVar9 = strlen(local_1f8);
                  local_1f8[(int)sVar9] = cVar2 + 'A';
                  local_1f8[(int)sVar9 + 1] = '\0';
                }
                local_260 = 0;
                iVar8 = ffgky(newptr_local,0x52,local_1f8,&cdelt,(char *)0x0,&local_260);
                if (iVar8 == 0) {
                  if (lpixels[(long)anynull + -1] < fpixels[(long)anynull + -1]) {
                    dVar11 = ((double)fpixels[(long)anynull + -1] - cdelt) /
                             (double)incs[(long)anynull + -1];
                  }
                  else {
                    dVar11 = (cdelt - (double)fpixels[(long)anynull + -1]) /
                             (double)incs[(long)anynull + -1];
                  }
                  cdelt = dVar11 + 1.0;
                  ffmkyd((fitsfile *)expr_local,local_1f8,cdelt,0xf,(char *)0x0,_naxis);
                  if ((incs[(long)anynull + -1] != 1) ||
                     (lpixels[(long)anynull + -1] < fpixels[(long)anynull + -1])) {
                    ffkeyn("CDELT",anynull + 1,local_1f8,_naxis);
                    if (local_2d8 != -1) {
                      sVar9 = strlen(local_1f8);
                      local_1f8[(int)sVar9] = cVar2 + 'A';
                      local_1f8[(int)sVar9 + 1] = '\0';
                    }
                    local_260 = 0;
                    iVar8 = ffgky(newptr_local,0x52,local_1f8,&local_350,(char *)0x0,&local_260);
                    if (iVar8 == 0) {
                      if (lpixels[(long)anynull + -1] < fpixels[(long)anynull + -1]) {
                        lVar1 = -incs[(long)anynull + -1];
                      }
                      else {
                        lVar1 = incs[(long)anynull + -1];
                      }
                      local_350 = local_350 * (double)lVar1;
                      ffmkyd((fitsfile *)expr_local,local_1f8,local_350,0xf,(char *)0x0,_naxis);
                    }
                    ffkeyn("CD1_",anynull + 1,local_1f8,_naxis);
                    if (local_2d8 != -1) {
                      sVar9 = strlen(local_1f8);
                      local_1f8[(int)sVar9] = cVar2 + 'A';
                      local_1f8[(int)sVar9 + 1] = '\0';
                    }
                    for (outnaxes[8]._4_4_ = 0; outnaxes[8]._4_4_ < 9;
                        outnaxes[8]._4_4_ = outnaxes[8]._4_4_ + 1) {
                      local_1f8[2] = (char)outnaxes[8]._4_4_ + '1';
                      local_260 = 0;
                      iVar8 = ffgky(newptr_local,0x52,local_1f8,&local_350,(char *)0x0,&local_260);
                      if (iVar8 == 0) {
                        if (lpixels[(long)anynull + -1] < fpixels[(long)anynull + -1]) {
                          lVar1 = -incs[(long)anynull + -1];
                        }
                        else {
                          lVar1 = incs[(long)anynull + -1];
                        }
                        local_350 = local_350 * (double)lVar1;
                        ffmkyd((fitsfile *)expr_local,local_1f8,local_350,0xf,(char *)0x0,_naxis);
                      }
                    }
                  }
                }
              }
            }
          }
          iVar8 = ffrdef((fitsfile *)expr_local,_naxis);
          if (iVar8 < 1) {
            ffpscl(newptr_local,1.0,0.0,_naxis);
            ffpscl((fitsfile *)expr_local,1.0,0.0,_naxis);
            buffsize = outsize;
            iVar8 = numkeys;
            if (numkeys < 1) {
              iVar8 = -numkeys;
            }
            buffer = (double *)((iVar8 / 8) * outsize);
            crpix = (double)malloc((size_t)buffer);
            lVar7 = fpixels[2];
            lVar6 = fpixels[1];
            lVar5 = fpixels[0];
            lVar4 = lpixels[2];
            lVar3 = lpixels[1];
            lVar1 = lpixels[0];
            if ((void *)crpix == (void *)0x0) {
              ffpmsg("fits_copy_image_section: no memory for image section");
              *_naxis = 0x71;
              fptr_local._4_4_ = 0x71;
            }
            else {
              if (lpixels[0] < fpixels[0]) {
                lVar10 = fpixels[0] - lpixels[0];
              }
              else {
                lVar10 = lpixels[0] - fpixels[0];
              }
              kiter = (lVar10 + incs[0]) / incs[0];
              if (lpixels[1] < fpixels[1]) {
                lVar10 = fpixels[1] - lpixels[1];
              }
              else {
                lVar10 = lpixels[1] - fpixels[1];
              }
              nrowiter = (lVar10 + incs[1]) / incs[1];
              if (lpixels[2] < fpixels[2]) {
                lVar10 = fpixels[2] - lpixels[2];
              }
              else {
                lVar10 = lpixels[2] - fpixels[2];
              }
              nsliceiter = (lVar10 + incs[2]) / incs[2];
              ncubeiter = 1;
              for (jiter = 0; jiter < nsliceiter; jiter = jiter + 1) {
                if (lVar4 < lVar7) {
                  lVar10 = -(jiter * incs[2]);
                }
                else {
                  lVar10 = jiter * incs[2];
                }
                fpixels[2] = lVar7 + lVar10;
                lpixels[2] = fpixels[2];
                for (iiter = 0; iiter < nrowiter; iiter = iiter + 1) {
                  if (lVar3 < lVar6) {
                    lVar10 = -(iiter * incs[1]);
                  }
                  else {
                    lVar10 = iiter * incs[1];
                  }
                  fpixels[1] = lVar6 + lVar10;
                  lpixels[1] = fpixels[1];
                  for (_kk = 0; _kk < kiter; _kk = _kk + 1) {
                    if (lVar1 < lVar5) {
                      lVar10 = -(_kk * incs[0]);
                    }
                    else {
                      lVar10 = _kk * incs[0];
                    }
                    fpixels[0] = lVar5 + lVar10;
                    lpixels[0] = fpixels[0];
                    if (numkeys == 8) {
                      ffgsvb(newptr_local,1,nkey,&smin,&local_f8,&local_148,(long *)&cptr,'\0',
                             (uchar *)crpix,(int *)((long)&minrow + 4),_naxis);
                      ffpprb((fitsfile *)expr_local,1,ncubeiter,buffsize,(uchar *)crpix,_naxis);
                    }
                    else if (numkeys == 0x10) {
                      ffgsvi(newptr_local,1,nkey,&smin,&local_f8,&local_148,(long *)&cptr,0,
                             (short *)crpix,(int *)((long)&minrow + 4),_naxis);
                      ffppri((fitsfile *)expr_local,1,ncubeiter,buffsize,(short *)crpix,_naxis);
                    }
                    else if (numkeys == 0x20) {
                      ffgsvk(newptr_local,1,nkey,&smin,&local_f8,&local_148,(long *)&cptr,0,
                             (int *)crpix,(int *)((long)&minrow + 4),_naxis);
                      ffpprk((fitsfile *)expr_local,1,ncubeiter,buffsize,(int *)crpix,_naxis);
                    }
                    else if (numkeys == -0x20) {
                      ffgsve(newptr_local,1,nkey,&smin,&local_f8,&local_148,(long *)&cptr,
                             -9.11912e-36,(float *)crpix,(int *)((long)&minrow + 4),_naxis);
                      ffppne((fitsfile *)expr_local,1,ncubeiter,buffsize,(float *)crpix,-9.11912e-36
                             ,_naxis);
                    }
                    else if (numkeys == -0x40) {
                      ffgsvd(newptr_local,1,nkey,&smin,&local_f8,&local_148,(long *)&cptr,
                             -9.1191291391491e-36,(double *)crpix,(int *)((long)&minrow + 4),_naxis)
                      ;
                      ffppnd((fitsfile *)expr_local,1,ncubeiter,buffsize,(double *)crpix,
                             -9.1191291391491e-36,_naxis);
                    }
                    else if (numkeys == 0x40) {
                      ffgsvjj(newptr_local,1,nkey,&smin,&local_f8,&local_148,(long *)&cptr,0,
                              (LONGLONG *)crpix,(int *)((long)&minrow + 4),_naxis);
                      ffpprjj((fitsfile *)expr_local,1,ncubeiter,buffsize,(LONGLONG *)crpix,_naxis);
                    }
                    ncubeiter = buffsize + ncubeiter;
                  }
                }
              }
              free((void *)crpix);
              if (*_naxis < 1) {
                fptr_local._4_4_ = *_naxis;
              }
              else {
                ffpmsg("fits_copy_image_section: error copying image section");
                fptr_local._4_4_ = *_naxis;
              }
            }
          }
          else {
            fptr_local._4_4_ = *_naxis;
          }
        }
        else {
          ffpmsg("error copying header from input image to output image");
          fptr_local._4_4_ = *_naxis;
        }
      }
    }
    else {
      fptr_local._4_4_ = *_naxis;
    }
  }
  else {
    fptr_local._4_4_ = *_naxis;
  }
  return fptr_local._4_4_;
}

Assistant:

int fits_copy_image_section(
           fitsfile *fptr,  /* I - pointer to input image */
           fitsfile *newptr,  /* I - pointer to output image */
           char *expr,       /* I - Image section expression    */
           int *status)
{
  /*
     copies an image section from the input file to a new output HDU
  */

    int bitpix, naxis, numkeys, nkey;
    long naxes[] = {1,1,1,1,1,1,1,1,1}, smin, smax, sinc;
    long fpixels[] = {1,1,1,1,1,1,1,1,1};
    long lpixels[] = {1,1,1,1,1,1,1,1,1};
    long incs[] = {1,1,1,1,1,1,1,1,1};
    char *cptr, keyname[FLEN_KEYWORD], card[FLEN_CARD];
    int ii, tstatus, anynull;
    long minrow, maxrow, minslice, maxslice, mincube, maxcube;
    long firstpix;
    long ncubeiter, nsliceiter, nrowiter, kiter, jiter, iiter;
    int klen, kk, jj;
    long outnaxes[9], outsize, buffsize;
    double *buffer, crpix, cdelt;

    if (*status > 0)
        return(*status);

    /* get the size of the input image */
    fits_get_img_type(fptr, &bitpix, status);
    fits_get_img_dim(fptr, &naxis, status);
    if (fits_get_img_size(fptr, naxis, naxes, status) > 0)
        return(*status);

    if (naxis < 1 || naxis > 4)
    {
        ffpmsg(
        "Input image either had NAXIS = 0 (NULL image) or has > 4 dimensions");
        return(*status = BAD_NAXIS);
    }

    /* create output image with same size and type as the input image */
    /*  Will update the size later */
    fits_create_img(newptr, bitpix, naxis, naxes, status);

    /* copy all other non-structural keywords from the input to output file */
    fits_get_hdrspace(fptr, &numkeys, NULL, status);

    for (nkey = 4; nkey <= numkeys; nkey++) /* skip the first few keywords */
    {
        fits_read_record(fptr, nkey, card, status);

        if (fits_get_keyclass(card) > TYP_CMPRS_KEY)
        {
            /* write the record to the output file */
            fits_write_record(newptr, card, status);
        }
    }

    if (*status > 0)
    {
         ffpmsg("error copying header from input image to output image");
         return(*status);
    }

    /* parse the section specifier to get min, max, and inc for each axis */
    /* and the size of each output image axis */

    cptr = expr;
    for (ii=0; ii < naxis; ii++)
    {
       if (fits_get_section_range(&cptr, &smin, &smax, &sinc, status) > 0)
       {
          ffpmsg("error parsing the following image section specifier:");
          ffpmsg(expr);
          return(*status);
       }

       if (smax == 0)
          smax = naxes[ii];   /* use whole axis  by default */
       else if (smin == 0)
          smin = naxes[ii];   /* use inverted whole axis */

       if (smin > naxes[ii] || smax > naxes[ii])
       {
          ffpmsg("image section exceeds dimensions of input image:");
          ffpmsg(expr);
          return(*status = BAD_NAXIS);
       }

       fpixels[ii] = smin;
       lpixels[ii] = smax;
       incs[ii] = sinc;

       if (smin <= smax)
           outnaxes[ii] = (smax - smin + sinc) / sinc;
       else
           outnaxes[ii] = (smin - smax + sinc) / sinc;

       /* modify the NAXISn keyword */
       fits_make_keyn("NAXIS", ii + 1, keyname, status);
       fits_modify_key_lng(newptr, keyname, outnaxes[ii], NULL, status);

       /* modify the WCS keywords if necessary */

       if (fpixels[ii] != 1 || incs[ii] != 1)
       {
            for (kk=-1;kk<26; kk++)  /* modify any alternate WCS keywords */
	{
         /* read the CRPIXn keyword if it exists in the input file */
         fits_make_keyn("CRPIX", ii + 1, keyname, status);
	 
         if (kk != -1) {
	   klen = strlen(keyname);
	   keyname[klen]='A' + kk;
	   keyname[klen + 1] = '\0';
	 }

         tstatus = 0;
         if (fits_read_key(fptr, TDOUBLE, keyname, 
             &crpix, NULL, &tstatus) == 0)
         {
           /* calculate the new CRPIXn value */
           if (fpixels[ii] <= lpixels[ii]) {
             crpix = (crpix - (fpixels[ii])) / incs[ii] + 1.0;
              /*  crpix = (crpix - (fpixels[ii] - 1.0) - .5) / incs[ii] + 0.5; */
           } else {
             crpix = (fpixels[ii] - crpix)  / incs[ii] + 1.0;
             /* crpix = (fpixels[ii] - (crpix - 1.0) - .5) / incs[ii] + 0.5; */
           }

           /* modify the value in the output file */
           fits_modify_key_dbl(newptr, keyname, crpix, 15, NULL, status);

           if (incs[ii] != 1 || fpixels[ii] > lpixels[ii])
           {
             /* read the CDELTn keyword if it exists in the input file */
             fits_make_keyn("CDELT", ii + 1, keyname, status);

             if (kk != -1) {
	       klen = strlen(keyname);
	       keyname[klen]='A' + kk;
	       keyname[klen + 1] = '\0';
	     }

             tstatus = 0;
             if (fits_read_key(fptr, TDOUBLE, keyname, 
                 &cdelt, NULL, &tstatus) == 0)
             {
               /* calculate the new CDELTn value */
               if (fpixels[ii] <= lpixels[ii])
                 cdelt = cdelt * incs[ii];
               else
                 cdelt = cdelt * (-incs[ii]);
              
               /* modify the value in the output file */
               fits_modify_key_dbl(newptr, keyname, cdelt, 15, NULL, status);
             }

             /* modify the CDi_j keywords if they exist in the input file */

             fits_make_keyn("CD1_", ii + 1, keyname, status);

             if (kk != -1) {
	       klen = strlen(keyname);
	       keyname[klen]='A' + kk;
	       keyname[klen + 1] = '\0';
	     }

             for (jj=0; jj < 9; jj++)   /* look for up to 9 dimensions */
	     {
	       keyname[2] = '1' + jj;
	       
               tstatus = 0;
               if (fits_read_key(fptr, TDOUBLE, keyname, 
                 &cdelt, NULL, &tstatus) == 0)
               {
                 /* calculate the new CDi_j value */
                 if (fpixels[ii] <= lpixels[ii])
                   cdelt = cdelt * incs[ii];
                 else
                   cdelt = cdelt * (-incs[ii]);
              
                 /* modify the value in the output file */
                 fits_modify_key_dbl(newptr, keyname, cdelt, 15, NULL, status);
               }
	     }
	     
           } /* end of if (incs[ii]... loop */
         }   /* end of fits_read_key loop */
	}    /* end of for (kk  loop */
       }
    }  /* end of main NAXIS loop */

    if (ffrdef(newptr, status) > 0)  /* force the header to be scanned */
    {
        return(*status);
    }

    /* turn off any scaling of the pixel values */
    fits_set_bscale(fptr,  1.0, 0.0, status);
    fits_set_bscale(newptr, 1.0, 0.0, status);

    /* to reduce memory foot print, just read/write image 1 row at a time */

    outsize = outnaxes[0];
    buffsize = (abs(bitpix) / 8) * outsize;

    buffer = (double *) malloc(buffsize); /* allocate memory for the image row */
    if (!buffer)
    {
        ffpmsg("fits_copy_image_section: no memory for image section");
        return(*status = MEMORY_ALLOCATION);
    }

    /* read the image section then write it to the output file */

    minrow = fpixels[1];
    maxrow = lpixels[1];
    if (minrow > maxrow) {
        nrowiter = (minrow - maxrow + incs[1]) / incs[1];
    } else {
        nrowiter = (maxrow - minrow + incs[1]) / incs[1];
    }

    minslice = fpixels[2];
    maxslice = lpixels[2];
    if (minslice > maxslice) {
        nsliceiter = (minslice - maxslice + incs[2]) / incs[2];
    } else {
        nsliceiter = (maxslice - minslice + incs[2]) / incs[2];
    }

    mincube = fpixels[3];
    maxcube = lpixels[3];
    if (mincube > maxcube) {
        ncubeiter = (mincube - maxcube + incs[3]) / incs[3];
    } else {
        ncubeiter = (maxcube - mincube + incs[3]) / incs[3];
    }

    firstpix = 1;
    for (kiter = 0; kiter < ncubeiter; kiter++)
    {
      if (mincube > maxcube) {
	 fpixels[3] = mincube - (kiter * incs[3]);
      } else {
	 fpixels[3] = mincube + (kiter * incs[3]);
      }
      
      lpixels[3] = fpixels[3];

      for (jiter = 0; jiter < nsliceiter; jiter++)
      {
        if (minslice > maxslice) {
	    fpixels[2] = minslice - (jiter * incs[2]);
        } else {
	    fpixels[2] = minslice + (jiter * incs[2]);
        }

	lpixels[2] = fpixels[2];

        for (iiter = 0; iiter < nrowiter; iiter++)
        {
            if (minrow > maxrow) {
	       fpixels[1] = minrow - (iiter * incs[1]);
	    } else {
	       fpixels[1] = minrow + (iiter * incs[1]);
            }

	    lpixels[1] = fpixels[1];

	    if (bitpix == 8)
	    {
	        ffgsvb(fptr, 1, naxis, naxes, fpixels, lpixels, incs, 0,
	            (unsigned char *) buffer, &anynull, status);

	        ffpprb(newptr, 1, firstpix, outsize, (unsigned char *) buffer, status);
	    }
	    else if (bitpix == 16)
	    {
	        ffgsvi(fptr, 1, naxis, naxes, fpixels, lpixels, incs, 0,
	            (short *) buffer, &anynull, status);

	        ffppri(newptr, 1, firstpix, outsize, (short *) buffer, status);
	    }
	    else if (bitpix == 32)
	    {
	        ffgsvk(fptr, 1, naxis, naxes, fpixels, lpixels, incs, 0,
	            (int *) buffer, &anynull, status);

	        ffpprk(newptr, 1, firstpix, outsize, (int *) buffer, status);
	    }
	    else if (bitpix == -32)
	    {
	        ffgsve(fptr, 1, naxis, naxes, fpixels, lpixels, incs, FLOATNULLVALUE,
	            (float *) buffer, &anynull, status);

	        ffppne(newptr, 1, firstpix, outsize, (float *) buffer, FLOATNULLVALUE, status);
	    }
	    else if (bitpix == -64)
	    {
	        ffgsvd(fptr, 1, naxis, naxes, fpixels, lpixels, incs, DOUBLENULLVALUE,
	             buffer, &anynull, status);

	        ffppnd(newptr, 1, firstpix, outsize, buffer, DOUBLENULLVALUE,
	               status);
	    }
	    else if (bitpix == 64)
	    {
	        ffgsvjj(fptr, 1, naxis, naxes, fpixels, lpixels, incs, 0,
	            (LONGLONG *) buffer, &anynull, status);

	        ffpprjj(newptr, 1, firstpix, outsize, (LONGLONG *) buffer, status);
	    }

            firstpix += outsize;
        }
      }
    }

    free(buffer);  /* finished with the memory */

    if (*status > 0)
    {
        ffpmsg("fits_copy_image_section: error copying image section");
        return(*status);
    }

    return(*status);
}